

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_test.h
# Opt level: O1

void randomPos_RandomSize<FakeAllocatorUnderTest,(MEM_ACCESS_TYPE)2>
               (FakeAllocatorUnderTest *allocatorUnderTest,size_t iterCount,size_t maxItems,
               size_t maxItemSizeExp,size_t threadID)

{
  undefined8 *puVar1;
  CommonTestResults *pCVar2;
  undefined1 auVar3 [16];
  undefined4 uVar4;
  uint uVar5;
  size_t i;
  size_t sVar6;
  uint8_t *puVar7;
  long lVar8;
  void *__s;
  void *pvVar9;
  ulong uVar10;
  long lVar11;
  FakeAllocatorUnderTest *extraout_RAX;
  FakeAllocatorUnderTest *pFVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  double *pdVar16;
  ulong uVar17;
  ulong uVar18;
  unsigned_long obj_2;
  ulong uVar19;
  size_t k;
  size_t j;
  long lVar20;
  ulong *puVar21;
  ulong *puVar22;
  long lVar23;
  long in_FS_OFFSET;
  Pareto_80_20_6_Data paretoData;
  uint local_c0;
  uint local_a8;
  uint local_70 [5];
  uint local_5c;
  uint local_58 [8];
  ModuleID local_38;
  
  sVar6 = GetMillisecondCount();
  allocatorUnderTest->start = sVar6;
  pCVar2 = allocatorUnderTest->testRes;
  pCVar2->threadID = threadID;
  uVar10 = rdtsc();
  allocatorUnderTest->testRes->rdtscBegin =
       uVar10 & 0xffffffff00000000 | CONCAT44((int)((ulong)pCVar2 >> 0x20),(int)uVar10);
  puVar7 = (uint8_t *)operator_new__(0x1000000);
  allocatorUnderTest->fakeBuffer = puVar7;
  if (maxItems >> 0x20 != 0) {
    nodecpp::assert::onAssertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/test/random_test.h"
               ,0x1de,"maxItems <= UINT32_MAX",true);
  }
  local_70[0] = 0x431bde82;
  local_5c = 0xfffbce41;
  lVar8 = 1;
  uVar14 = 0x431bde82;
  do {
    uVar14 = uVar14 + (int)(long)(Pareto_80_20_6[lVar8] * 4294967295.0);
    local_70[lVar8] = uVar14;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 5);
  local_58[0] = 0;
  local_58[7] = (uint)maxItems;
  uVar14 = 0;
  pdVar16 = Pareto_80_20_6 + 6;
  lVar8 = 7;
  do {
    uVar14 = uVar14 + (int)(long)(*pdVar16 * (double)(maxItems & 0xffffffff));
    local_70[lVar8] = uVar14;
    pdVar16 = pdVar16 + -1;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0xd);
  GetMillisecondCount();
  __s = operator_new__(-(ulong)(maxItems >> 0x3c != 0) | maxItems << 4);
  pvVar9 = memset(__s,0,maxItems << 4);
  if (0x1f < maxItems) {
    bVar13 = (byte)(maxItemSizeExp - 3);
    local_a8 = ~(uint)(-1L << (bVar13 & 0x3f));
    puVar21 = (ulong *)((long)__s + 8);
    pvVar9 = (void *)0x0;
    do {
      uVar10 = *(long *)(in_FS_OFFSET + -0x28) + 0x6595a395a1ec5333;
      *(ulong *)(in_FS_OFFSET + -0x28) = uVar10;
      uVar10 = (uVar10 >> 0x20 ^ uVar10) * 0x6595a395a1ec5333;
      lVar8 = (uVar10 >> 0x20 ^ uVar10) * 0x6595a395a1ec5333;
      lVar20 = 0;
      puVar22 = puVar21;
      do {
        if ((((uint)((ulong)lVar8 >> 0x20) ^ (uint)lVar8) >> ((uint)lVar20 & 0x1f) & 1) != 0) {
          uVar10 = *(long *)(in_FS_OFFSET + -0x28) + 0x6595a395a1ec5333;
          *(ulong *)(in_FS_OFFSET + -0x28) = uVar10;
          if (maxItemSizeExp < 3) {
            nodecpp::assert::onAssertionFailed
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/test/random_test.h"
                       ,0x58,"maxSizeExp >= 3",true);
          }
          uVar10 = (uVar10 >> 0x20 ^ uVar10) * 0x6595a395a1ec5333;
          uVar17 = (uVar10 >> 0x20 ^ uVar10) * 0x6595a395a1ec5333;
          uVar17 = uVar17 >> 0x20 ^ uVar17;
          uVar14 = ((uint)uVar17 & local_a8) + 1;
          uVar10 = 0;
          if (uVar14 != 0) {
            for (; (uVar14 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
            }
          }
          if (maxItemSizeExp - 3 < uVar10) {
            nodecpp::assert::onAssertionFailed
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/test/random_test.h"
                       ,0x66,"idx <= maxSizeExp",true);
          }
          lVar11 = 4L << ((byte)uVar10 & 0x3f);
          uVar10 = (lVar11 - 1U & uVar17 >> (bVar13 & 0x3f)) + lVar11 + 1;
          *puVar22 = uVar10;
          if (0x1000000 < uVar10) {
            nodecpp::assert::onAssertionFailed
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/test/random_test.h"
                       ,0x192,"sz <= fakeBufferSize",true);
          }
          puVar7 = allocatorUnderTest->fakeBuffer;
          puVar22[-1] = (ulong)puVar7;
          memset(puVar7,(int)uVar10,uVar10);
        }
        lVar20 = lVar20 + 1;
        puVar22 = puVar22 + 2;
      } while (lVar20 != 0x20);
      pvVar9 = (void *)((long)pvVar9 + 1);
      puVar21 = puVar21 + 0x40;
    } while (pvVar9 != (void *)(maxItems >> 5));
  }
  uVar5 = local_5c;
  uVar14 = local_70[0];
  uVar10 = rdtsc();
  allocatorUnderTest->testRes->rdtscSetup =
       uVar10 & 0xffffffff00000000 | CONCAT44((int)((ulong)pvVar9 >> 0x20),(int)uVar10);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = iterCount;
  uVar4 = SUB164(auVar3 * ZEXT816(0x346dc5d63886594b),4);
  if (iterCount < 10000) {
    obj_2 = 0;
  }
  else {
    bVar13 = (byte)(maxItemSizeExp - 3);
    local_c0 = ~(uint)(-1L << (bVar13 & 0x3f));
    obj_2 = 0;
    uVar10 = 0;
    do {
      lVar8 = 0;
      do {
        lVar20 = *(long *)(in_FS_OFFSET + -0x28);
        uVar17 = lVar20 + 0x6595a395a1ec5333;
        *(ulong *)(in_FS_OFFSET + -0x28) = uVar17;
        uVar17 = (uVar17 >> 0x20 ^ uVar17) * 0x6595a395a1ec5333;
        uVar17 = (uVar17 >> 0x20 ^ uVar17) * 0x6595a395a1ec5333;
        uVar15 = (uint)uVar17 ^ (uint)(uVar17 >> 0x20);
        if (uVar15 < uVar14) {
          lVar11 = 0;
        }
        else {
          lVar11 = 1;
          if ((((local_70[1] <= uVar15) && (lVar11 = 2, local_70[2] <= uVar15)) &&
              (lVar11 = 3, local_70[3] <= uVar15)) && (lVar11 = 4, local_70[4] <= uVar15)) {
            lVar11 = 6 - (ulong)(uVar15 < uVar5);
          }
        }
        lVar23 = ((uVar17 >> 0x20) % (ulong)(local_58[lVar11 + 1] - local_58[lVar11]) +
                 (ulong)local_58[lVar11]) * 0x10;
        puVar1 = (undefined8 *)(lVar23 + (long)__s);
        lVar11 = *(long *)((long)__s + lVar23);
        if (lVar11 == 0) {
          uVar17 = lVar20 + 0xcb2b472b43d8a666;
          *(ulong *)(in_FS_OFFSET + -0x28) = uVar17;
          if (maxItemSizeExp < 3) {
            nodecpp::assert::onAssertionFailed
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/test/random_test.h"
                       ,0x58,"maxSizeExp >= 3",true);
          }
          uVar17 = (uVar17 >> 0x20 ^ uVar17) * 0x6595a395a1ec5333;
          uVar19 = (uVar17 >> 0x20 ^ uVar17) * 0x6595a395a1ec5333;
          uVar19 = uVar19 >> 0x20 ^ uVar19;
          uVar15 = ((uint)uVar19 & local_c0) + 1;
          uVar17 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
            }
          }
          if (maxItemSizeExp - 3 < uVar17) {
            nodecpp::assert::onAssertionFailed
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/test/random_test.h"
                       ,0x66,"idx <= maxSizeExp",true);
          }
          lVar20 = 4L << ((byte)uVar17 & 0x3f);
          uVar17 = (lVar20 - 1U & uVar19 >> (bVar13 & 0x3f)) + lVar20 + 1;
          *(ulong *)((long)__s + lVar23 + 8) = uVar17;
          if (0x1000000 < uVar17) {
            nodecpp::assert::onAssertionFailed
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/test/random_test.h"
                       ,0x192,"sz <= fakeBufferSize",true);
          }
          puVar7 = allocatorUnderTest->fakeBuffer;
          *puVar1 = puVar7;
          memset(puVar7,(int)uVar17,uVar17);
        }
        else {
          uVar17 = puVar1[1];
          if (uVar17 < 8) {
            uVar19 = 0;
          }
          else {
            uVar19 = 0;
            do {
              obj_2 = obj_2 + *(long *)(lVar11 + uVar19 * 8);
              uVar19 = uVar19 + 1;
            } while (uVar17 >> 3 != uVar19);
            uVar19 = uVar17 & 0xfffffffffffffff8;
          }
          if ((uVar17 & 7) != 0) {
            uVar18 = 0;
            do {
              obj_2 = obj_2 + *(byte *)(lVar11 + uVar19 + uVar18);
              uVar18 = uVar18 + 1;
            } while ((uVar17 & 7) != uVar18);
          }
          *puVar1 = 0;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 10000);
      uVar10 = uVar10 + 1;
      uVar4 = (undefined4)(uVar10 >> 0x20);
    } while (uVar10 != iterCount / 10000);
  }
  uVar10 = rdtsc();
  allocatorUnderTest->testRes->rdtscMainLoop =
       uVar10 & 0xffffffff00000000 | CONCAT44(uVar4,(int)uVar10);
  if (maxItems != 0) {
    sVar6 = 0;
    do {
      lVar8 = *(long *)((long)__s + sVar6 * 0x10);
      if (lVar8 != 0) {
        uVar10 = *(ulong *)((long)__s + sVar6 * 0x10 + 8);
        if (uVar10 < 8) {
          uVar17 = 0;
        }
        else {
          uVar17 = 0;
          do {
            obj_2 = obj_2 + *(long *)(lVar8 + uVar17 * 8);
            uVar17 = uVar17 + 1;
          } while (uVar10 >> 3 != uVar17);
          uVar17 = uVar10 & 0xfffffffffffffff8;
        }
        if ((uVar10 & 7) != 0) {
          uVar19 = 0;
          do {
            obj_2 = obj_2 + *(byte *)(lVar8 + uVar17 + uVar19);
            uVar19 = uVar19 + 1;
          } while ((uVar10 & 7) != uVar19);
        }
      }
      sVar6 = sVar6 + 1;
    } while (sVar6 != maxItems);
  }
  operator_delete__(__s);
  pFVar12 = allocatorUnderTest;
  if (allocatorUnderTest->fakeBuffer != (uint8_t *)0x0) {
    operator_delete__(allocatorUnderTest->fakeBuffer);
    pFVar12 = extraout_RAX;
  }
  allocatorUnderTest->fakeBuffer = (uint8_t *)0x0;
  uVar10 = rdtsc();
  allocatorUnderTest->testRes->rdtscExit =
       uVar10 & 0xffffffff00000000 | CONCAT44((int)((ulong)pFVar12 >> 0x20),(int)uVar10);
  sVar6 = GetMillisecondCount();
  allocatorUnderTest->testRes->innerDur = sVar6 - allocatorUnderTest->start;
  local_38.str = (char *)0x0;
  nodecpp::log::default_log::log<char_const*,unsigned_long,unsigned_long,unsigned_long>
            (&local_38,info,"about to exit thread {} ({} operations performed) [ctr = {}]...",
             threadID,iterCount,obj_2);
  return;
}

Assistant:

void randomPos_RandomSize( AllocatorUnderTest& allocatorUnderTest, size_t iterCount, size_t maxItems, size_t maxItemSizeExp, size_t threadID )
{
	constexpr bool doMemAccess = mat != MEM_ACCESS_TYPE::none;
	constexpr bool doFullAccess = mat == MEM_ACCESS_TYPE::full;
//	nodecpp::log::default_log::info( "rnd_seed = {}, iterCount = {}, maxItems = {}, maxItemSizeExp = {}", rnd_seed, iterCount, maxItems, maxItemSizeExp );
	allocatorUnderTest.init( threadID );

	size_t dummyCtr = 0;

	Pareto_80_20_6_Data paretoData;
	NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, maxItems <= UINT32_MAX );
	Pareto_80_20_6_Init( paretoData, (uint32_t)maxItems );

	size_t start = GetMillisecondCount();

	struct TestBin
	{
		uint8_t* ptr;
		size_t sz;
	};

	TestBin* baseBuff = nullptr; 
	if ( !allocatorUnderTest.isFake() )
		baseBuff = reinterpret_cast<TestBin*>( allocatorUnderTest.allocate( maxItems * sizeof(TestBin) ) );
	else
		baseBuff = new TestBin [ maxItems ]; // just using standard allocator
	NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, baseBuff );
	memset( baseBuff, 0, maxItems * sizeof( TestBin ) );

	// setup (saturation)
	for ( size_t i=0;i<maxItems/32; ++i )
	{
		uint32_t randNum = (uint32_t)( rng64() );
		for ( size_t j=0; j<32; ++j )
			if ( (randNum >> j) & 1 )
			{
				size_t randNumSz = rng64();
				size_t sz = calcSizeWithStatsAdjustment( randNumSz, maxItemSizeExp );
				baseBuff[i*32+j].sz = sz;
				baseBuff[i*32+j].ptr = reinterpret_cast<uint8_t*>( allocatorUnderTest.allocate( sz ) );
				if constexpr ( doMemAccess )
				{
					if constexpr ( doFullAccess )
						memset( baseBuff[i*32+j].ptr, (uint8_t)sz, sz );
					else
					{
						static_assert( mat == MEM_ACCESS_TYPE::single, "" );
						baseBuff[i*32+j].ptr[sz/2] = (uint8_t)sz;
					}
				}
			}
	}
	allocatorUnderTest.doWhateverAfterSetupPhase();

	// main loop
	for ( size_t j=0;j<iterCount/10000; ++j )
	{
		for ( size_t k=0;k<10000; ++k )
		{
			size_t randNum = rng64();
	//		size_t idx = randNum % maxItems;
			uint32_t rnum1 = (uint32_t)randNum;
			uint32_t rnum2 = (uint32_t)(randNum >> 32);
			size_t idx = Pareto_80_20_6_Rand( paretoData, rnum1, rnum2 );
			if ( baseBuff[idx].ptr )
			{
				if constexpr ( doMemAccess )
				{
					if constexpr ( doFullAccess )
					{
						size_t i=0;
						for ( ; i<baseBuff[idx].sz/sizeof(size_t ); ++i )
							dummyCtr += ( reinterpret_cast<size_t*>( baseBuff[idx].ptr) )[i];
						uint8_t* tail = baseBuff[idx].ptr + i * sizeof(size_t );
						for ( i=0; i<baseBuff[idx].sz % sizeof(size_t); ++i )
							dummyCtr += tail[i];
					}
					else
					{
						static_assert( mat == MEM_ACCESS_TYPE::single, "" );
						dummyCtr += baseBuff[idx].ptr[baseBuff[idx].sz/2];
					}
				}
				allocatorUnderTest.deallocate( baseBuff[idx].ptr );
				baseBuff[idx].ptr = 0;
			}
			else
			{
				size_t sz = calcSizeWithStatsAdjustment( rng64(), maxItemSizeExp );
				baseBuff[idx].sz = sz;
				baseBuff[idx].ptr = reinterpret_cast<uint8_t*>( allocatorUnderTest.allocate( sz ) );
				if constexpr ( doMemAccess )
				{
					if constexpr ( doFullAccess )
						memset( baseBuff[idx].ptr, (uint8_t)sz, sz );
					else
					{
						static_assert( mat == MEM_ACCESS_TYPE::single, "" );
						baseBuff[idx].ptr[sz/2] = (uint8_t)sz;
					}
				}
			}
		}
		allocatorUnderTest.doWhateverWithinMainLoopPhase();
	}
	allocatorUnderTest.doWhateverAfterMainLoopPhase();

	// exit
	for ( size_t idx=0; idx<maxItems; ++idx )
		if ( baseBuff[idx].ptr )
		{
			if constexpr ( doMemAccess )
			{
				if constexpr ( doFullAccess )
				{
					size_t i=0;
					for ( ; i<baseBuff[idx].sz/sizeof(size_t ); ++i )
						dummyCtr += ( reinterpret_cast<size_t*>( baseBuff[idx].ptr) )[i];
					uint8_t* tail = baseBuff[idx].ptr + i * sizeof(size_t );
					for ( i=0; i<baseBuff[idx].sz % sizeof(size_t); ++i )
						dummyCtr += tail[i];
				}
				else
				{
					static_assert( mat == MEM_ACCESS_TYPE::single, "" );
					dummyCtr += baseBuff[idx].ptr[baseBuff[idx].sz/2];
				}
			}
			allocatorUnderTest.deallocate( baseBuff[idx].ptr );
		}

	if ( !allocatorUnderTest.isFake() )
		allocatorUnderTest.deallocate( baseBuff );
	else
		delete [] baseBuff;
	allocatorUnderTest.deinit();
	allocatorUnderTest.doWhateverAfterCleanupPhase();
		
	nodecpp::log::default_log::info( "about to exit thread {} ({} operations performed) [ctr = {}]...", threadID, iterCount, dummyCtr );
}